

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O3

void __thiscall wabt::OptionParser::PrintHelp(OptionParser *this)

{
  string *this_00;
  int iVar1;
  pointer pOVar2;
  size_type sVar3;
  size_type sVar4;
  pointer pcVar5;
  Option *option;
  pointer pAVar6;
  pointer pOVar7;
  long *plVar8;
  undefined8 *puVar9;
  long *plVar10;
  size_type *psVar11;
  ulong uVar12;
  char *__format;
  ulong uVar13;
  long lVar14;
  pointer pOVar15;
  size_type *local_b0;
  string line;
  __string_type __str;
  long local_60;
  long lStack_58;
  size_type *local_50;
  string flag;
  
  printf("usage: %s [options]",(this->program_name_)._M_dataplus._M_p);
  pAVar6 = (this->arguments_).
           super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->arguments_).
      super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
      ._M_impl.super__Vector_impl_data._M_finish != pAVar6) {
    lVar14 = 0x20;
    uVar13 = 0;
    do {
      iVar1 = *(int *)((long)&(pAVar6->name)._M_dataplus._M_p + lVar14);
      __format = " %s";
      if (iVar1 == 0) {
LAB_00f4d94d:
        printf(__format,*(undefined8 *)((long)pAVar6 + lVar14 + -0x20));
      }
      else if (iVar1 == 1) {
        __format = " %s+";
        goto LAB_00f4d94d;
      }
      uVar13 = uVar13 + 1;
      pAVar6 = (this->arguments_).
               super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar14 = lVar14 + 0x50;
    } while (uVar13 < (ulong)(((long)(this->arguments_).
                                     super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar6 >> 4)
                             * -0x3333333333333333));
  }
  puts("\n");
  puts((this->description_)._M_dataplus._M_p);
  puts("options:");
  pOVar15 = (this->options_).
            super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pOVar2 = (this->options_).
           super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pOVar15 != pOVar2) {
    uVar13 = 0;
    pOVar7 = pOVar15;
    do {
      sVar3 = (pOVar7->long_name)._M_string_length;
      if (sVar3 != 0) {
        sVar4 = (pOVar7->metavar)._M_string_length;
        lVar14 = sVar4 + 1;
        if (sVar4 == 0) {
          lVar14 = 0;
        }
        uVar12 = lVar14 + sVar3;
        if (uVar13 < uVar12) {
          uVar13 = uVar12;
        }
      }
      pOVar7 = pOVar7 + 1;
    } while (pOVar7 != pOVar2);
    if (pOVar15 != pOVar2) {
      this_00 = (string *)(line.field_2._M_local_buf + 8);
      do {
        if ((pOVar15->short_name != '\0') || ((pOVar15->long_name)._M_string_length != 0)) {
          local_b0 = &line._M_string_length;
          line._M_dataplus._M_p = (pointer)0x0;
          line._M_string_length._0_1_ = 0;
          if (pOVar15->short_name == '\0') {
            std::__cxx11::string::append((string *)&local_b0,"      ");
          }
          else {
            line.field_2._8_8_ = &__str._M_string_length;
            std::__cxx11::string::_M_construct<char_const*>(this_00,"  -","");
            plVar8 = (long *)std::__cxx11::string::_M_replace_aux
                                       (this_00,(ulong)__str._M_dataplus._M_p,0,1,
                                        pOVar15->short_name);
            plVar10 = plVar8 + 2;
            if ((long *)*plVar8 == plVar10) {
              local_60 = *plVar10;
              lStack_58 = plVar8[3];
              __str.field_2._8_8_ = &local_60;
            }
            else {
              local_60 = *plVar10;
              __str.field_2._8_8_ = (long *)*plVar8;
            }
            *plVar8 = (long)plVar10;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append
                                       ((string *)(__str.field_2._M_local_buf + 8),", ");
            local_50 = &flag._M_string_length;
            psVar11 = (size_type *)(plVar8 + 2);
            if ((size_type *)*plVar8 == psVar11) {
              flag._M_string_length = *psVar11;
              flag.field_2._M_allocated_capacity = plVar8[3];
            }
            else {
              flag._M_string_length = *psVar11;
              local_50 = (size_type *)*plVar8;
            }
            flag._M_dataplus._M_p = (pointer)plVar8[1];
            *plVar8 = (long)psVar11;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((string *)&local_b0,(char *)local_50,(ulong)flag._M_dataplus._M_p);
            if (local_50 != &flag._M_string_length) {
              operator_delete(local_50);
            }
            if ((long *)__str.field_2._8_8_ != &local_60) {
              operator_delete((void *)__str.field_2._8_8_);
            }
            if ((size_type *)line.field_2._8_8_ != &__str._M_string_length) {
              operator_delete((void *)line.field_2._8_8_);
            }
          }
          local_50 = &flag._M_string_length;
          flag._M_dataplus._M_p = (pointer)0x0;
          flag._M_string_length = flag._M_string_length & 0xffffffffffffff00;
          if ((pOVar15->long_name)._M_string_length != 0) {
            std::__cxx11::string::_M_replace((string *)&local_50,0,0,"--",2);
            if ((pOVar15->metavar)._M_string_length == 0) {
              std::__cxx11::string::_M_append
                        ((string *)&local_50,(pOVar15->long_name)._M_dataplus._M_p,
                         (pOVar15->long_name)._M_string_length);
            }
            else {
              line.field_2._8_8_ = &__str._M_string_length;
              pcVar5 = (pOVar15->long_name)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        (this_00,pcVar5,pcVar5 + (pOVar15->long_name)._M_string_length);
              std::__cxx11::string::_M_replace_aux(this_00,(ulong)__str._M_dataplus._M_p,0,1,'=');
              puVar9 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 (this_00,(pOVar15->metavar)._M_dataplus._M_p,
                                  (pOVar15->metavar)._M_string_length);
              plVar8 = puVar9 + 2;
              if ((long *)*puVar9 == plVar8) {
                local_60 = *plVar8;
                lStack_58 = puVar9[3];
                __str.field_2._8_8_ = &local_60;
              }
              else {
                local_60 = *plVar8;
                __str.field_2._8_8_ = (long *)*puVar9;
              }
              uVar12 = puVar9[1];
              *puVar9 = plVar8;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              std::__cxx11::string::_M_append
                        ((string *)&local_50,(char *)__str.field_2._8_8_,uVar12);
              if ((long *)__str.field_2._8_8_ != &local_60) {
                operator_delete((void *)__str.field_2._8_8_);
              }
              if ((size_type *)line.field_2._8_8_ != &__str._M_string_length) {
                operator_delete((void *)line.field_2._8_8_);
              }
            }
          }
          line.field_2._8_8_ = &__str._M_string_length;
          std::__cxx11::string::_M_construct
                    (this_00,(uVar13 + 10) - (long)flag._M_dataplus._M_p,' ');
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace
                             (this_00,0,0,(char *)local_50,(ulong)flag._M_dataplus._M_p);
          plVar8 = puVar9 + 2;
          if ((long *)*puVar9 == plVar8) {
            local_60 = *plVar8;
            lStack_58 = puVar9[3];
            __str.field_2._8_8_ = &local_60;
          }
          else {
            local_60 = *plVar8;
            __str.field_2._8_8_ = (long *)*puVar9;
          }
          uVar12 = puVar9[1];
          *puVar9 = plVar8;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          std::__cxx11::string::_M_append((string *)&local_b0,(char *)__str.field_2._8_8_,uVar12);
          if ((long *)__str.field_2._8_8_ != &local_60) {
            operator_delete((void *)__str.field_2._8_8_);
          }
          if ((size_type *)line.field_2._8_8_ != &__str._M_string_length) {
            operator_delete((void *)line.field_2._8_8_);
          }
          uVar12 = (pOVar15->help)._M_string_length;
          if (uVar12 != 0) {
            std::__cxx11::string::_M_append
                      ((string *)&local_b0,(pOVar15->help)._M_dataplus._M_p,uVar12);
          }
          puts((char *)local_b0);
          if (local_50 != &flag._M_string_length) {
            operator_delete(local_50);
          }
          if (local_b0 != &line._M_string_length) {
            operator_delete(local_b0);
          }
        }
        pOVar15 = pOVar15 + 1;
      } while (pOVar15 != pOVar2);
    }
  }
  return;
}

Assistant:

void OptionParser::PrintHelp() {
  printf("usage: %s [options]", program_name_.c_str());

  for (size_t i = 0; i < arguments_.size(); ++i) {
    Argument& argument = arguments_[i];
    switch (argument.count) {
      case ArgumentCount::One:
        printf(" %s", argument.name.c_str());
        break;

      case ArgumentCount::OneOrMore:
        printf(" %s+", argument.name.c_str());
        break;
    }
  }

  printf("\n\n");
  printf("%s\n", description_.c_str());
  printf("options:\n");

  const size_t kExtraSpace = 8;
  size_t longest_name_length = 0;
  for (const Option& option : options_) {
    size_t length;
    if (!option.long_name.empty()) {
      length = option.long_name.size();
      if (!option.metavar.empty()) {
        // +1 for '='.
        length += option.metavar.size() + 1;
      }
    } else {
      continue;
    }

    if (length > longest_name_length) {
      longest_name_length = length;
    }
  }

  for (const Option& option : options_) {
    if (!option.short_name && option.long_name.empty()) {
      continue;
    }

    std::string line;
    if (option.short_name) {
      line += std::string("  -") + option.short_name + ", ";
    } else {
      line += "      ";
    }

    std::string flag;
    if (!option.long_name.empty()) {
      flag = "--";
      if (!option.metavar.empty()) {
        flag += option.long_name + '=' + option.metavar;
      } else {
        flag += option.long_name;
      }
    }

    // +2 for "--" of the long flag name.
    size_t remaining = longest_name_length + kExtraSpace + 2 - flag.size();
    line += flag + std::string(remaining, ' ');

    if (!option.help.empty()) {
      line += option.help;
    }
    printf("%s\n", line.c_str());
  }
}